

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_choice.cpp
# Opt level: O0

void Am_Choice_Outside_Method_proc
               (Am_Object *inter,Am_Object *object,Am_Object *event_window,Am_Input_Event *ev)

{
  int x;
  int y;
  Am_Value *pAVar1;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58 [3];
  Am_Object local_40;
  Am_Object command_obj;
  Am_Inter_Internal_Method inter_method;
  Am_Input_Event *ev_local;
  Am_Object *event_window_local;
  Am_Object *object_local;
  Am_Object *inter_local;
  
  Am_Inter_Internal_Method::Am_Inter_Internal_Method((Am_Inter_Internal_Method *)&command_obj);
  pAVar1 = Am_Object::Get(&Am_Interactor,0xc0,0);
  Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&command_obj,pAVar1);
  (*(code *)inter_method.from_wrapper)(inter,object,event_window,ev);
  Am_Object::Am_Object(&local_40);
  pAVar1 = Am_Object::Get(inter,0xc5,0);
  Am_Object::operator=(&local_40,pAVar1);
  Am_Object::Am_Object(local_58,&local_40);
  Am_Object::Am_Object(&local_60,object);
  Am_Object::Am_Object(&local_68,inter);
  x = ev->x;
  y = ev->y;
  Am_Object::Am_Object(&local_70,event_window);
  Choice_Handle_New_Old(local_58,&local_60,&local_68,x,y,&local_70,ev->input_char);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(local_58);
  Am_Object::~Am_Object(&local_40);
  return;
}

Assistant:

Am_Define_Method(Am_Inter_Internal_Method, void, Am_Choice_Outside_Method,
                 (Am_Object & inter, Am_Object &object, Am_Object &event_window,
                  Am_Input_Event *ev))
{
  Am_INTER_TRACE_PRINT(inter, "Choice Outside");

  // first, call the prototype's method
  Am_Inter_Internal_Method inter_method;
  inter_method = Am_Interactor.Get(Am_INTER_OUTSIDE_METHOD);
  inter_method.Call(inter, object, event_window, ev);

  Am_Object command_obj;
  command_obj = inter.Get(Am_COMMAND);
  Choice_Handle_New_Old(command_obj, object, inter, ev->x, ev->y, event_window,
                        ev->input_char);
}